

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O1

wchar_t mapglyph(nh_dbuf_entry_conflict *dbe,curses_symdef_conflict *syms,wchar_t *bg_color)

{
  undefined8 *puVar1;
  short sVar2;
  ushort uVar3;
  curses_symdef_conflict *pcVar4;
  curses_symdef_conflict *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  nh_bool nVar9;
  curses_drawing_info *pcVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  uint uVar14;
  curses_symdef_conflict *pcVar15;
  wchar_t wVar16;
  ulong uVar17;
  wchar_t wVar18;
  ushort uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  int iVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  wchar_t wVar25;
  
  pcVar10 = cur_drawing;
  wVar16 = dbe->effect;
  if (wVar16 == L'\0') {
    if (dbe->invis == '\0') {
      wVar16 = (wchar_t)dbe->mon;
      if (dbe->mon != 0) {
        if ((cur_drawing->num_monsters < wVar16) && ((dbe->monflags & 8) != 0)) {
          pcVar15 = cur_drawing->warnings + (~cur_drawing->num_monsters + wVar16);
        }
        else {
          pcVar15 = cur_drawing->monsters + (long)wVar16 + -1;
        }
        *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar15->unichar + 5);
        uVar20 = *(undefined4 *)&pcVar15->symname;
        uVar21 = *(undefined4 *)((long)&pcVar15->symname + 4);
        iVar22 = pcVar15->color;
        wVar16 = pcVar15->unichar[0];
        wVar18 = pcVar15->unichar[1];
        wVar23 = pcVar15->unichar[2];
        wVar24 = pcVar15->unichar[3];
        wVar25 = pcVar15->unichar[4];
        goto LAB_00112d6d;
      }
      uVar17 = 0;
    }
    else {
      pcVar15 = cur_drawing->invis;
      *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar15->unichar + 5);
      uVar20 = *(undefined4 *)&pcVar15->symname;
      uVar21 = *(undefined4 *)((long)&pcVar15->symname + 4);
      iVar22 = pcVar15->color;
      wVar16 = pcVar15->unichar[0];
      wVar18 = pcVar15->unichar[1];
      wVar23 = pcVar15->unichar[2];
      wVar24 = pcVar15->unichar[3];
      wVar25 = pcVar15->unichar[4];
LAB_00112d6d:
      syms->unichar[1] = wVar18;
      syms->unichar[2] = wVar23;
      syms->unichar[3] = wVar24;
      syms->unichar[4] = wVar25;
      *(undefined4 *)&syms->symname = uVar20;
      *(undefined4 *)((long)&syms->symname + 4) = uVar21;
      syms->color = iVar22;
      syms->unichar[0] = wVar16;
      uVar17 = 1;
      if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (syms->color != 0)) {
        syms->color = (uint)(7 < syms->color) * 8 + 7;
      }
    }
    pcVar10 = cur_drawing;
    if ((long)dbe->obj != 0) {
      lVar13 = (long)dbe->obj + -1;
      sVar2 = dbe->obj_mn;
      pcVar15 = syms + uVar17;
      pcVar5 = cur_drawing->objects;
      *(undefined8 *)(pcVar15->unichar + 5) = *(undefined8 *)(pcVar5[lVar13].unichar + 5);
      pcVar4 = pcVar5 + lVar13;
      pcVar6 = pcVar4->symname;
      iVar22 = pcVar4->color;
      wVar16 = pcVar4->unichar[0];
      uVar7 = *(undefined8 *)(pcVar5[lVar13].unichar + 1 + 2);
      *(undefined8 *)(pcVar15->unichar + 1) = *(undefined8 *)(pcVar5[lVar13].unichar + 1);
      *(undefined8 *)(pcVar15->unichar + 3) = uVar7;
      pcVar15->symname = pcVar6;
      pcVar15->color = iVar22;
      pcVar15->unichar[0] = wVar16;
      if (corpse_id == (wchar_t)lVar13) {
        pcVar15->color = pcVar10->monsters[(long)sVar2 + -1].color;
      }
      if ((dbe->objflags & 2) != 0) {
        pcVar15->color = 0xd;
      }
      if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (pcVar15->color != 0))
      {
        pcVar15->color = (uint)(7 < pcVar15->color) * 8 + 7;
      }
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
        darken_symdef(pcVar15);
      }
      uVar17 = (ulong)((int)uVar17 + 1);
    }
    if ((long)dbe->trap != 0) {
      lVar13 = (long)dbe->trap + -1;
      pcVar15 = syms + uVar17;
      pcVar5 = cur_drawing->traps;
      *(undefined8 *)(pcVar15->unichar + 5) = *(undefined8 *)(pcVar5[lVar13].unichar + 5);
      pcVar4 = pcVar5 + lVar13;
      pcVar6 = pcVar4->symname;
      iVar22 = pcVar4->color;
      wVar16 = pcVar4->unichar[0];
      uVar7 = *(undefined8 *)(pcVar5[lVar13].unichar + 1 + 2);
      *(undefined8 *)(pcVar15->unichar + 1) = *(undefined8 *)(pcVar5[lVar13].unichar + 1);
      *(undefined8 *)(pcVar15->unichar + 3) = uVar7;
      pcVar15->symname = pcVar6;
      pcVar15->color = iVar22;
      pcVar15->unichar[0] = wVar16;
      if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (pcVar15->color != 0))
      {
        pcVar15->color = (uint)(7 < pcVar15->color) * 8 + 7;
      }
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
        darken_symdef(pcVar15);
      }
      if (((wchar_t)lVar13 == mportal_id) || ((wchar_t)lVar13 == vibsquare_id)) {
        *bg_color = L'\x01';
      }
      uVar17 = (ulong)((int)uVar17 + 1);
    }
    wVar16 = (wchar_t)uVar17;
    if ((wVar16 != L'\0') && ((int)dbe->bg < cur_drawing->bg_feature_offset)) goto LAB_00113158;
    pcVar15 = syms + uVar17;
    pcVar5 = cur_drawing->bgelements;
    sVar2 = dbe->bg;
    *(undefined8 *)(pcVar15->unichar + 5) = *(undefined8 *)(pcVar5[sVar2].unichar + 5);
    pcVar4 = pcVar5 + sVar2;
    pcVar6 = pcVar4->symname;
    iVar22 = pcVar4->color;
    wVar18 = pcVar4->unichar[0];
    uVar7 = *(undefined8 *)(pcVar5[sVar2].unichar + 1 + 2);
    *(undefined8 *)(pcVar15->unichar + 1) = *(undefined8 *)(pcVar5[sVar2].unichar + 1);
    *(undefined8 *)(pcVar15->unichar + 3) = uVar7;
    pcVar15->symname = pcVar6;
    pcVar15->color = iVar22;
    wVar23 = level_display_mode;
    nVar9 = settings.mapcolors;
    pcVar15->unichar[0] = wVar18;
    if (settings.mapcolors != '\0') {
      wVar18 = (wchar_t)dbe->bg;
      switch(level_display_mode) {
      case L'\x01':
        if (vwall_id <= wVar18) {
          iVar22 = 9;
LAB_00112fb8:
          if (wVar18 <= trwall_id) goto LAB_00113004;
        }
        break;
      case L'\x03':
        if (((vwall_id <= wVar18) && (wVar18 <= trwall_id)) && ((dbe->dgnflags & 0x1f80U) == 0)) {
          iVar22 = 3;
LAB_00113004:
          pcVar15->color = iVar22;
        }
        break;
      case L'\x04':
        if (vwall_id <= wVar18) {
          iVar22 = 0xc;
          goto LAB_00112fb8;
        }
        break;
      case L'\a':
        iVar22 = 10;
        if ((room_id == wVar18) || (iVar22 = 2, darkroom_id == wVar18)) goto LAB_00113004;
      }
      uVar3 = dbe->dgnflags;
      uVar19 = uVar3 & 0x1f80;
      if (uVar19 == 0x200) {
        if ((vwall_id <= wVar18) && (iVar22 = 0xd, wVar18 <= trwall_id)) goto LAB_001130c6;
      }
      else {
        if (uVar19 == 0x100) {
          iVar22 = 10;
          if (((wVar18 < vwall_id || trwall_id < wVar18) && (room_id != wVar18)) &&
             (ndoor_id != wVar18)) {
            iVar22 = 2;
LAB_001130a6:
            if (darkroom_id != wVar18) goto LAB_001130ca;
          }
        }
        else {
          if (uVar19 != 0x80) goto LAB_001130ca;
          iVar22 = 0xb;
          if (((wVar18 < vwall_id || trwall_id < wVar18) && (room_id != wVar18)) &&
             (ndoor_id != wVar18)) {
            iVar22 = 3;
            goto LAB_001130a6;
          }
        }
LAB_001130c6:
        pcVar15->color = iVar22;
      }
LAB_001130ca:
      if (((vcdoor_id == wVar18) || (hcdoor_id == wVar18)) &&
         ((iVar22 = 6, (uVar3 & 0x10) != 0 ||
          ((iVar22 = 1, (uVar3 & 4) != 0 || (iVar22 = 2, (uVar3 & 2) != 0)))))) {
        pcVar15->color = iVar22;
      }
      if (altar_id == wVar18) {
        iVar22 = 0xd;
        if (wVar23 != L'\x06') {
          switch(uVar3 & 0x60) {
          case 0:
            iVar22 = 1;
            break;
          case 0x20:
            iVar22 = 0xf;
            break;
          case 0x40:
            iVar22 = 7;
            break;
          case 0x60:
            iVar22 = 10;
            if ((uVar3 & 0x60) == 0x60) {
              iVar22 = 0;
            }
          }
        }
        pcVar15->color = iVar22;
      }
    }
    if (((nVar9 != '\0') && (level_display_mode == L'\b')) && (pcVar15->color != 0)) {
      pcVar15->color = (uint)(7 < pcVar15->color) * 8 + 7;
    }
    if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
      darken_symdef(pcVar15);
    }
    wVar16 = wVar16 + L'\x01';
LAB_00113158:
    wVar18 = (wchar_t)dbe->bg;
    if (((upstair_id == wVar18) || (dnstair_id == wVar18)) ||
       ((upladder_id == wVar18 ||
        (((dnladder_id == wVar18 || (upsstair_id == wVar18)) || (dnsstair_id == wVar18)))))) {
      *bg_color = L'\x01';
    }
    if ((dbe->mon == 0) && (dbe->invis == '\0')) {
      return wVar16;
    }
    *bg_color = L'\0';
    return wVar16;
  }
  if (4 < (uint)(wVar16 >> 0x10)) goto LAB_00112cfd;
  uVar14 = wVar16 + L'\xffff';
  uVar11 = uVar14 & 0xffff;
  switch(wVar16 >> 0x10) {
  case L'\0':
    pcVar4 = cur_drawing->explsyms;
    uVar14 = uVar11 % 9;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar4[uVar14].unichar + 5);
    pcVar15 = pcVar4 + uVar14;
    pcVar6 = pcVar15->symname;
    iVar22 = pcVar15->color;
    wVar16 = pcVar15->unichar[0];
    uVar7 = *(undefined8 *)(pcVar4[uVar14].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar4[uVar14].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar7;
    syms->symname = pcVar6;
    syms->color = iVar22;
    syms->unichar[0] = wVar16;
    piVar12 = &pcVar10->expltypes[(ulong)uVar11 / 9].color;
    break;
  case L'\x01':
    pcVar4 = cur_drawing->swallowsyms;
    uVar14 = uVar14 & 7;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar4[uVar14].unichar + 5);
    pcVar15 = pcVar4 + uVar14;
    pcVar6 = pcVar15->symname;
    iVar22 = pcVar15->color;
    wVar16 = pcVar15->unichar[0];
    uVar7 = *(undefined8 *)(pcVar4[uVar14].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar4[uVar14].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar7;
    syms->symname = pcVar6;
    syms->color = iVar22;
    syms->unichar[0] = wVar16;
    pcVar15 = pcVar10->monsters;
    uVar11 = uVar11 >> 3;
    goto LAB_00112ceb;
  case L'\x02':
    pcVar15 = cur_drawing->zapsyms;
    goto LAB_00112c8c;
  case L'\x03':
    pcVar15 = cur_drawing->breathsyms;
LAB_00112c8c:
    uVar14 = uVar14 & 3;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar15[uVar14].unichar + 5);
    pcVar4 = pcVar15 + uVar14;
    pcVar6 = pcVar4->symname;
    iVar22 = pcVar4->color;
    wVar16 = pcVar4->unichar[0];
    uVar7 = *(undefined8 *)(pcVar15[uVar14].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar15[uVar14].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar7;
    syms->symname = pcVar6;
    syms->color = iVar22;
    syms->unichar[0] = wVar16;
    pcVar15 = pcVar10->zaptypes;
    uVar11 = uVar11 >> 2;
LAB_00112ceb:
    piVar12 = &pcVar15[uVar11].color;
    break;
  case L'\x04':
    pcVar15 = cur_drawing->effects;
    lVar13 = (ulong)(uVar11 << 3) * 5;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)((long)pcVar15->unichar + lVar13 + 0x14);
    puVar1 = (undefined8 *)((long)pcVar15->unichar + lVar13 + -0xc);
    pcVar6 = (char *)*puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)pcVar15->unichar + lVar13 + 4);
    uVar8 = puVar1[1];
    *(undefined8 *)(syms->unichar + 1) = *puVar1;
    *(undefined8 *)(syms->unichar + 3) = uVar8;
    syms->symname = pcVar6;
    syms->color = (int)uVar7;
    syms->unichar[0] = (int)((ulong)uVar7 >> 0x20);
    piVar12 = (int *)((long)pcVar10->effects->unichar + lVar13 + -4);
  }
  syms->color = *piVar12;
LAB_00112cfd:
  if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (syms->color != 0)) {
    syms->color = (uint)(7 < syms->color) * 8 + 7;
  }
  return L'\x01';
}

Assistant:

int mapglyph(struct nh_dbuf_entry *dbe, struct curses_symdef *syms, int *bg_color)
{
    int id, count = 0;

    if (dbe->effect) {
	id = NH_EFFECT_ID(dbe->effect);

	switch (NH_EFFECT_TYPE(dbe->effect)) {
	    case E_EXPLOSION:
		syms[0] = cur_drawing->explsyms[id % NUMEXPCHARS];
		syms[0].color = cur_drawing->expltypes[id / NUMEXPCHARS].color;
		break;

	    case E_SWALLOW:
		syms[0] = cur_drawing->swallowsyms[id & 0x7];
		syms[0].color = cur_drawing->monsters[id >> 3].color;
		break;

	    case E_ZAP:
		syms[0] = cur_drawing->zapsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_BREATH:
		syms[0] = cur_drawing->breathsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_MISC:
		syms[0] = cur_drawing->effects[id];
		syms[0].color = cur_drawing->effects[id].color;
		break;
	}

	valley_symdef(&syms[0]);

	return 1; /* we don't want to show other glyphs under effects */
    }
    
    if (dbe->invis) {
	syms[count] = cur_drawing->invis[0];
	valley_symdef(&syms[count]);
	count++;
    } else if (dbe->mon) {
	if (dbe->mon > cur_drawing->num_monsters && (dbe->monflags & MON_WARNING)) {
	    id = dbe->mon - 1 - cur_drawing->num_monsters;
	    syms[count] = cur_drawing->warnings[id];
	} else {
	    id = dbe->mon - 1;
	    syms[count] = cur_drawing->monsters[id];
	}
	valley_symdef(&syms[count]);
	count++;
    }
    
    if (dbe->obj) {
	object_symdef(dbe->obj - 1, dbe->obj_mn - 1, &syms[count]);

	if (dbe->objflags & DOBJ_PRIZE)
	    syms[count].color = CLR_BRIGHT_MAGENTA;
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	count++;
    }
    
    if (dbe->trap) {
	id = dbe->trap - 1;
	syms[count] = cur_drawing->traps[id];

	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	if (id == mportal_id || id == vibsquare_id)
	    *bg_color = CLR_RED;

	count++;
    } 
    
    /* omit the background symbol from the list if it is boring */
    if (count == 0 || dbe->bg >= cur_drawing->bg_feature_offset) {
	syms[count] = cur_drawing->bgelements[dbe->bg];
	recolor_bg(dbe, &syms[count]);
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);
	count++;
    }

    if (dbe->bg == upstair_id  || dbe->bg == dnstair_id  ||
	dbe->bg == upladder_id || dbe->bg == dnladder_id ||
	dbe->bg == upsstair_id || dbe->bg == dnsstair_id) {
	*bg_color = CLR_RED;
    }

    /* monsters override background color, NAO-style */
    if (dbe->mon || dbe->invis)
	*bg_color = 0;

    return count; /* count <= 4 */
}